

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O0

int __thiscall trng::poisson_dist::operator()(poisson_dist *this,lcg64_shift *r)

{
  int x_00;
  iterator first;
  iterator last;
  size_t sVar1;
  poisson_dist *this_00;
  poisson_dist *ppVar2;
  long in_RDI;
  double dVar3;
  int x_i;
  size_t x;
  double p;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_18;
  
  local_18 = utility::uniformco<double,trng::lcg64_shift>((lcg64_shift *)0x391002);
  first = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffa8);
  last = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffa8);
  sVar1 = utility::
          discrete<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last._M_current);
  x_00 = (int)sVar1;
  this_00 = (poisson_dist *)(sVar1 + 1);
  ppVar2 = (poisson_dist *)
           std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
  if (this_00 == ppVar2) {
    dVar3 = cdf(this_00,(int)((ulong)in_RDI >> 0x20));
    for (local_18 = local_18 - dVar3; 0.0 < local_18; local_18 = local_18 - dVar3) {
      x_00 = x_00 + 1;
      dVar3 = pdf((poisson_dist *)last._M_current,x_00);
    }
  }
  return x_00;
}

Assistant:

int operator()(R &r) {
      double p{utility::uniformco<double>(r)};
      const std::size_t x{utility::discrete(p, P.P_.begin(), P.P_.end())};
      int x_i{static_cast<int>(x)};
      if (x + 1 == P.P_.size()) {
        p -= cdf(x_i);
        while (p > 0) {
          ++x_i;
          p -= pdf(x_i);
        }
      }
      return x_i;
    }